

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

bool google::protobuf::compiler::js::anon_unknown_0::HasExtensions(Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *field;
  Descriptor *desc_00;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Descriptor *desc_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = Descriptor::extension_count(desc);
    if (iVar2 <= local_1c) {
      local_20 = 0;
      while( true ) {
        iVar2 = Descriptor::nested_type_count(desc);
        if (iVar2 <= local_20) {
          return false;
        }
        desc_00 = Descriptor::nested_type(desc,local_20);
        bVar1 = HasExtensions(desc_00);
        if (bVar1) break;
        local_20 = local_20 + 1;
      }
      return true;
    }
    field = Descriptor::extension(desc,local_1c);
    bVar1 = ShouldGenerateExtension(field);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool HasExtensions(const Descriptor* desc) {
  for (int i = 0; i < desc->extension_count(); i++) {
    if (ShouldGenerateExtension(desc->extension(i))) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); i++) {
    if (HasExtensions(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}